

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.h
# Opt level: O0

MediumProperties * __thiscall
pbrt::GridMedium::SamplePoint(GridMedium *this,Point3f p,SampledWavelengths *lambda)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  Vector3<float> v;
  Point3f p_00;
  bool bVar5;
  DenselySampledSpectrum *in_RSI;
  MediumProperties *in_RDI;
  float fVar6;
  float fVar7;
  undefined1 in_ZMM0 [64];
  undefined1 auVar16 [56];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined4 uVar17;
  undefined1 in_ZMM1 [64];
  undefined1 auVar24 [56];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  SampledSpectrum SVar25;
  Point3<float> PVar26;
  Vector3f VVar27;
  float unaff_retaddr;
  Float temp;
  Float scale;
  SampledSpectrum Le;
  SampledGrid<float> *in_stack_000000e0;
  Float d;
  Tuple3<pbrt::Point3,_float> in_stack_000000f8;
  SampledSpectrum sigma_s;
  SampledSpectrum sigma_a;
  undefined4 in_stack_fffffffffffffe28;
  float in_stack_fffffffffffffe2c;
  BlackbodySpectrum *in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe38;
  Float in_stack_fffffffffffffe3c;
  MediumProperties *lambda_00;
  Bounds3<float> *in_stack_fffffffffffffe68;
  BlackbodySpectrum local_188;
  undefined8 in_stack_fffffffffffffe80;
  float in_stack_fffffffffffffe88;
  undefined8 local_120;
  undefined8 local_118;
  undefined4 in_stack_ffffffffffffffe4;
  MediumProperties *pMVar28;
  undefined1 auVar10 [64];
  
  auVar24 = in_ZMM1._8_56_;
  auVar16 = in_ZMM0._8_56_;
  vmovlpd_avx(in_ZMM0._0_16_);
  uVar17 = in_ZMM1._0_4_;
  lambda_00 = in_RDI;
  pMVar28 = in_RDI;
  SVar25 = DenselySampledSpectrum::Sample(in_RSI,(SampledWavelengths *)in_RDI);
  auVar18._0_8_ = SVar25.values.values._8_8_;
  auVar18._8_56_ = auVar24;
  auVar8._0_8_ = SVar25.values.values._0_8_;
  auVar8._8_56_ = auVar16;
  uVar1 = vmovlpd_avx(auVar8._0_16_);
  uVar2 = vmovlpd_avx(auVar18._0_16_);
  SVar25 = DenselySampledSpectrum::Sample(in_RSI,(SampledWavelengths *)lambda_00);
  auVar19._0_8_ = SVar25.values.values._8_8_;
  auVar19._8_56_ = auVar24;
  auVar9._0_8_ = SVar25.values.values._0_8_;
  auVar9._8_56_ = auVar16;
  uVar3 = vmovlpd_avx(auVar9._0_16_);
  uVar4 = vmovlpd_avx(auVar19._0_16_);
  auVar16 = ZEXT856(0);
  PVar26.super_Tuple3<pbrt::Point3,_float>.z = unaff_retaddr;
  PVar26.super_Tuple3<pbrt::Point3,_float>._0_8_ = pMVar28;
  PVar26 = Transform::ApplyInverse<float>
                     ((Transform *)CONCAT44(in_stack_ffffffffffffffe4,uVar17),PVar26);
  auVar10._0_8_ = PVar26.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar10._8_56_ = auVar16;
  vmovlpd_avx(auVar10._0_16_);
  auVar16 = ZEXT856(0);
  p_00.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffffe88;
  p_00.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)in_stack_fffffffffffffe80;
  p_00.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)in_stack_fffffffffffffe80 >> 0x20);
  VVar27 = Bounds3<float>::Offset(in_stack_fffffffffffffe68,p_00);
  auVar11._0_8_ = VVar27.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar11._8_56_ = auVar16;
  vmovlpd_avx(auVar11._0_16_);
  v.super_Tuple3<pbrt::Vector3,_float>._4_8_ = in_RDI;
  v.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffffe3c;
  Point3<float>::Point3<float>((Point3<float> *)0x688239,v);
  SampledGrid<float>::Lookup(in_stack_000000e0,(Point3f)in_stack_000000f8);
  SampledSpectrum::operator*=(&in_RDI->sigma_a,in_stack_fffffffffffffe3c);
  SampledSpectrum::operator*=(&in_RDI->sigma_a,in_stack_fffffffffffffe3c);
  SampledSpectrum::SampledSpectrum
            ((SampledSpectrum *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
  if ((in_RSI[10].values.nStored & 1) != 0) {
    fVar6 = SampledGrid<float>::Lookup(in_stack_000000e0,(Point3f)in_stack_000000f8);
    auVar16 = SUB6456(ZEXT1664((undefined1  [16])0x0),8);
    if (0.0 < fVar6) {
      bVar5 = pstd::optional::operator_cast_to_bool((optional *)&in_RSI[7].values);
      if (bVar5) {
        pstd::optional<pbrt::SampledGrid<float>_>::operator->
                  ((optional<pbrt::SampledGrid<float>_> *)0x6883b8);
        fVar7 = SampledGrid<float>::Lookup(in_stack_000000e0,(Point3f)in_stack_000000f8);
        auVar16 = (undefined1  [56])0x0;
        if (100.0 < (fVar7 - (float)in_RSI[0xb].lambda_min) *
                    *(float *)((long)&in_RSI[10].values.nStored + 4)) {
          auVar24 = (undefined1  [56])0x0;
          in_stack_fffffffffffffe30 = &local_188;
          BlackbodySpectrum::BlackbodySpectrum(in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
          SVar25 = BlackbodySpectrum::Sample
                             ((BlackbodySpectrum *)in_RDI,
                              (SampledWavelengths *)CONCAT44(fVar6,in_stack_fffffffffffffe38));
          auVar20._0_8_ = SVar25.values.values._8_8_;
          auVar20._8_56_ = auVar16;
          auVar12._0_8_ = SVar25.values.values._0_8_;
          auVar12._8_56_ = auVar24;
          auVar24 = (undefined1  [56])0x0;
          vmovlpd_avx(auVar12._0_16_);
          vmovlpd_avx(auVar20._0_16_);
          SVar25 = pbrt::operator*((Float)((ulong)in_stack_fffffffffffffe30 >> 0x20),
                                   (SampledSpectrum *)
                                   CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
          auVar21._0_8_ = SVar25.values.values._8_8_;
          auVar21._8_56_ = auVar16;
          auVar13._0_8_ = SVar25.values.values._0_8_;
          auVar13._8_56_ = auVar24;
          local_120 = vmovlpd_avx(auVar13._0_16_);
          local_118 = vmovlpd_avx(auVar21._0_16_);
        }
      }
      else {
        auVar24 = (undefined1  [56])0x0;
        SVar25 = DenselySampledSpectrum::Sample(in_RSI,(SampledWavelengths *)lambda_00);
        auVar22._0_8_ = SVar25.values.values._8_8_;
        auVar22._8_56_ = auVar16;
        auVar14._0_8_ = SVar25.values.values._0_8_;
        auVar14._8_56_ = auVar24;
        auVar24 = (undefined1  [56])0x0;
        vmovlpd_avx(auVar14._0_16_);
        vmovlpd_avx(auVar22._0_16_);
        SVar25 = pbrt::operator*((Float)((ulong)in_stack_fffffffffffffe30 >> 0x20),
                                 (SampledSpectrum *)CONCAT44(fVar6,in_stack_fffffffffffffe28));
        auVar23._0_8_ = SVar25.values.values._8_8_;
        auVar23._8_56_ = auVar16;
        auVar15._0_8_ = SVar25.values.values._0_8_;
        auVar15._8_56_ = auVar24;
        local_120 = vmovlpd_avx(auVar15._0_16_);
        local_118 = vmovlpd_avx(auVar23._0_16_);
        in_stack_fffffffffffffe2c = fVar6;
      }
    }
  }
  *(undefined8 *)(in_RDI->sigma_a).values.values = uVar1;
  *(undefined8 *)((in_RDI->sigma_a).values.values + 2) = uVar2;
  *(undefined8 *)(in_RDI->sigma_s).values.values = uVar3;
  *(undefined8 *)((in_RDI->sigma_s).values.values + 2) = uVar4;
  PhaseFunction::TaggedPointer<pbrt::HGPhaseFunction_const>
            ((PhaseFunction *)in_stack_fffffffffffffe30,
             (HGPhaseFunction *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  *(undefined8 *)(in_RDI->Le).values.values = local_120;
  *(undefined8 *)((in_RDI->Le).values.values + 2) = local_118;
  return lambda_00;
}

Assistant:

SamplePoint(Point3f p, const SampledWavelengths &lambda) const {
        // Sample spectra for grid medium $\sigmaa$ and $\sigmas$
        SampledSpectrum sigma_a = sigma_a_spec.Sample(lambda);
        SampledSpectrum sigma_s = sigma_s_spec.Sample(lambda);

        // Scale scattering coefficients by medium density at _p_
        p = renderFromMedium.ApplyInverse(p);
        p = Point3f(bounds.Offset(p));
        Float d = densityGrid.Lookup(p);
        sigma_a *= d;
        sigma_s *= d;

        // Compute grid emission _Le_ at _p_
        SampledSpectrum Le(0.f);
        if (isEmissive) {
            Float scale = LeScale.Lookup(p);
            if (scale > 0) {
                // Compute emitted radiance using _temperatureGrid_ or _Le_spec_
                if (temperatureGrid) {
                    Float temp = temperatureGrid->Lookup(p);
                    // Added after book publication: optionally offset and scale
                    // temperature based on user-supplied parameters. (Match
                    // NanoVDBMedium functionality.)
                    temp = (temp - temperatureOffset) * temperatureScale;
                    if (temp > 100.f)
                        Le = scale * BlackbodySpectrum(temp).Sample(lambda);
                } else
                    Le = scale * Le_spec.Sample(lambda);
            }
        }

        return MediumProperties{sigma_a, sigma_s, &phase, Le};
    }